

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O2

int lws_role_call_client_bind(lws *wsi,lws_client_connect_info *i)

{
  lws_role_ops *plVar1;
  _func_int_lws_ptr_lws_client_connect_info_ptr *p_Var2;
  int iVar3;
  int unaff_EBP;
  lws_role_ops **ppxx;
  lws_role_ops **pplVar4;
  
  pplVar4 = available_roles;
  do {
    do {
      plVar1 = *pplVar4;
      if (plVar1 == (lws_role_ops *)0x0) {
        iVar3 = rops_client_bind_raw_skt(wsi,i);
        if (iVar3 != 0) {
          return 0;
        }
        return 1;
      }
      pplVar4 = pplVar4 + 1;
      p_Var2 = plVar1->client_bind;
    } while (p_Var2 == (_func_int_lws_ptr_lws_client_connect_info_ptr *)0x0);
    iVar3 = (*p_Var2)(wsi,i);
    if (iVar3 != 0) {
      unaff_EBP = 0;
    }
    if (iVar3 < 0) {
      unaff_EBP = iVar3;
    }
  } while (iVar3 == 0);
  return unaff_EBP;
}

Assistant:

int
lws_role_call_client_bind(struct lws *wsi,
			  const struct lws_client_connect_info *i)
{
	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (ar->client_bind) {
			int m = ar->client_bind(wsi, i);
			if (m < 0)
				return m;
			if (m)
				return 0;
		}
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;

	/* fall back to raw socket role if, eg, h1 not configured */

	if (role_ops_raw_skt.client_bind &&
	    role_ops_raw_skt.client_bind(wsi, i))
		return 0;

	return 1;
}